

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginDragDropTargetCustom(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  
  pIVar3 = GImGui;
  if ((((GImGui->DragDropActive == true) && (GImGui->HoveredWindow != (ImGuiWindow *)0x0)) &&
      (pIVar1 = GImGui->CurrentWindow, pIVar1->RootWindow == GImGui->HoveredWindow->RootWindow)) &&
     (((bVar4 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar4 &&
       ((pIVar3->DragDropPayload).SourceId != id)) && (pIVar1->SkipItems == false)))) {
    IVar2 = bb->Max;
    (pIVar3->DragDropTargetRect).Min = bb->Min;
    (pIVar3->DragDropTargetRect).Max = IVar2;
    pIVar3->DragDropTargetId = id;
    pIVar3->DragDropWithinSourceOrTarget = true;
    return true;
  }
  return false;
}

Assistant:

bool ImGui::BeginDragDropTargetCustom(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow == NULL || window->RootWindow != g.HoveredWindow->RootWindow)
        return false;
    IM_ASSERT(id != 0);
    if (!IsMouseHoveringRect(bb.Min, bb.Max) || (id == g.DragDropPayload.SourceId))
        return false;
    if (window->SkipItems)
        return false;

    IM_ASSERT(g.DragDropWithinSourceOrTarget == false);
    g.DragDropTargetRect = bb;
    g.DragDropTargetId = id;
    g.DragDropWithinSourceOrTarget = true;
    return true;
}